

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O3

void ur_pp2(double *x,int N,char *type,char *model,int lshort,int *klag,double *cval,double *cprobs,
           double *auxstat,int *laux,double *teststat)

{
  ulong uVar1;
  double dVar2;
  int iVar3;
  char *pcVar4;
  double *__x;
  int iVar5;
  double *pdVar6;
  double *res;
  reg_object prVar7;
  void *pvVar8;
  double *pdVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  size_t sVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  void *pvVar19;
  double dVar20;
  double dVar21;
  void *pvVar22;
  double dVar23;
  double dVar24;
  char *pcVar25;
  void *pvVar26;
  double *local_e8;
  double *local_c0;
  double *local_a8;
  double local_88;
  double sig;
  char *local_78;
  double *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double *local_40;
  void *local_38;
  
  local_38 = (void *)CONCAT44(in_register_00000034,N);
  local_58 = (double)CONCAT44(local_58._4_4_,N + -1);
  local_60 = (double)(N + -1);
  local_78 = type;
  dVar15 = pow(local_60 / 100.0,0.25);
  uVar10 = (ulong)(uint)(int)(dVar15 * *(double *)(&DAT_00155c98 + (ulong)(lshort == 1) * 8));
  if ((klag != (int *)0x0) && (0 < *klag)) {
    uVar10 = (ulong)(uint)*klag;
  }
  pdVar12 = x + 1;
  local_40 = x;
  iVar5 = strcmp(model,"trend");
  local_50 = (double)uVar10;
  if (iVar5 == 0) {
    dVar15 = (double)(local_58._0_4_ * local_58._0_4_);
    *cval = -47.44 / dVar15 + -8.353 / local_60 + -3.9638;
    cval[1] = -17.83 / dVar15 + -4.039 / local_60 + -3.4126;
    cval[2] = -7.58 / dVar15 + -2.418 / local_60 + -3.1279;
    *cprobs = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;
    lVar14 = (long)local_58._0_4_;
    sVar11 = lVar14 * 8;
    pvVar19 = malloc(sVar11);
    res = (double *)malloc(sVar11);
    if (1 < (int)local_38) {
      uVar10 = 1;
      do {
        res[uVar10 - 1] = (double)(int)uVar10;
        *(double *)((long)pvVar19 + uVar10 * 8 + -8) = (double)(int)uVar10 - local_60 * 0.5;
        uVar10 = uVar10 + 1;
      } while (((ulong)local_38 & 0xffffffff) != uVar10);
    }
    pdVar6 = (double *)malloc(0x48);
    local_e8 = (double *)malloc(lVar14 << 4);
    pdVar9 = (double *)malloc(sVar11);
    memcpy(local_e8,local_40,sVar11);
    memcpy(local_e8 + lVar14,pvVar19,sVar11);
    iVar5 = local_58._0_4_;
    prVar7 = reg_init(local_58._0_4_,3);
    regress(prVar7,local_e8,pdVar12,pdVar9,pdVar6,0.95);
    dVar23 = prVar7->beta[0].value;
    dVar2 = prVar7[1].sigma_upper;
    dVar16 = prVar7->beta[0].stdErr;
    dVar18 = prVar7[1].R2[0];
    sig = (double)prVar7;
    dVar20 = mean(pdVar12,iVar5);
    local_68 = 0.0;
    dVar24 = 0.0;
    dVar21 = 0.0;
    local_48 = 0.0;
    pvVar8 = (void *)0x0;
    if (1 < (int)local_38) {
      uVar10 = 0;
      do {
        local_68 = local_68 + pdVar9[uVar10] * pdVar9[uVar10];
        dVar17 = pdVar12[uVar10];
        dVar24 = dVar24 + (dVar17 - dVar20) * (dVar17 - dVar20);
        pvVar8 = (void *)((double)pvVar8 + dVar17);
        dVar21 = dVar21 + dVar17 * dVar17;
        local_48 = local_48 + dVar17 * res[uVar10];
        uVar10 = uVar10 + 1;
      } while (((ulong)local_58 & 0xffffffff) != uVar10);
    }
    local_40 = (double *)(1.0 / local_60);
    local_68 = local_68 * (double)local_40;
    local_70 = pdVar9;
    local_38 = pvVar8;
    dVar17 = pow(local_60,-2.5);
    dVar17 = dVar17 * local_48;
    local_48 = pow(local_60,-1.5);
    dVar20 = local_50;
    local_48 = local_48 * (double)local_38;
    iVar5 = SUB84(local_50,0);
    pvVar8 = malloc((long)iVar5 * 4);
    sVar11 = (long)iVar5 << 3;
    local_a8 = (double *)malloc(sVar11);
    local_c0 = (double *)malloc(sVar11);
    pdVar12 = local_70;
    if (0 < iVar5) {
      uVar13 = (ulong)dVar20 & 0xffffffff;
      uVar10 = 0;
      do {
        uVar1 = uVar10 + 1;
        *(int *)((long)pvVar8 + uVar10 * 4) = (int)uVar1;
        uVar10 = uVar1;
      } while (uVar13 != uVar1);
      if (0 < iVar5) {
        uVar10 = 0;
        iVar5 = local_58._0_4_;
        pdVar9 = local_a8;
        local_38 = pvVar8;
        do {
          iVar3 = *(int *)((long)local_38 + uVar10 * 4);
          mmult(pdVar12 + iVar3,pdVar12,pdVar9,1,iVar5 - iVar3,1);
          uVar10 = uVar10 + 1;
          pdVar9 = pdVar9 + 1;
        } while (uVar13 != uVar10);
        iVar5 = SUB84(local_50,0);
        pvVar8 = local_38;
        if (0 < iVar5) {
          uVar10 = 0;
          do {
            local_c0[uVar10] =
                 1.0 - (double)*(int *)((long)local_38 + uVar10 * 4) / (double)(iVar5 + 1);
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
        }
      }
    }
    mmult(local_c0,local_a8,&local_88,1,iVar5,1);
    local_88 = (local_88 + local_88) / local_60 + local_68;
    local_50 = local_88;
    dVar20 = pow(local_60,-2.0);
    local_40 = (double *)
               (((double)local_40 + 1.0) * 12.0 * dVar17 * local_48 +
               dVar17 * -12.0 * dVar17 + (1.0 - dVar20) * dVar21 * (1.0 / dVar15));
    dVar20 = local_68 / local_88;
    pvVar22 = (void *)((2.0 / dVar15 + 6.0 / local_60 + 4.0) * local_48 * local_48);
    if (dVar20 < 0.0) {
      local_38 = pvVar22;
      local_58 = sqrt(dVar20);
      pvVar22 = local_38;
    }
    else {
      local_58 = SQRT(dVar20);
    }
    pcVar4 = local_78;
    prVar7 = (reg_object)sig;
    local_40 = (double *)((double)local_40 - (double)pvVar22);
    if (local_88 < 0.0) {
      local_38 = (void *)sqrt(local_88);
    }
    else {
      local_38 = (void *)SQRT(local_88);
    }
    pdVar12 = local_70;
    if ((double)local_40 < 0.0) {
      local_78 = (char *)sqrt((double)local_40);
    }
    else {
      local_78 = (char *)SQRT((double)local_40);
    }
    local_70 = (double *)(local_50 - local_68);
    dVar20 = local_48 * local_48 + (double)local_40;
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    local_70 = (double *)((double)local_70 * -0.5);
    local_50 = (double)local_70 / local_50;
    dVar21 = local_68 / local_88;
    if (dVar21 < 0.0) {
      sig = dVar20;
      local_38 = (void *)((double)local_38 * local_50);
      dVar21 = sqrt(dVar21);
      pvVar22 = local_38;
      dVar20 = sig;
    }
    else {
      dVar21 = SQRT(dVar21);
      pvVar22 = (void *)((double)local_38 * local_50);
    }
    if (local_88 < 0.0) {
      local_78 = (char *)((double)local_78 * dVar20);
      local_38 = (void *)((double)pvVar22 * local_48);
      sig = sqrt(local_88);
      pvVar22 = local_38;
      pcVar25 = local_78;
    }
    else {
      sig = SQRT(local_88);
      pvVar22 = (void *)((double)pvVar22 * local_48);
      pcVar25 = (char *)((double)local_78 * dVar20);
    }
    dVar23 = local_58 * (dVar23 / dVar16);
    dVar16 = (double)local_40 / 12.0;
    dVar24 = (1.0 / dVar15) * dVar24;
    if (dVar16 < 0.0) {
      local_58 = dVar23;
      local_48 = local_48 * 0.5;
      local_38 = (void *)((double)pvVar22 / (double)pcVar25);
      pvVar26 = (void *)sqrt(dVar16);
      dVar15 = local_48;
      dVar23 = local_58;
      pvVar22 = local_38;
    }
    else {
      pvVar26 = (void *)SQRT(dVar16);
      dVar15 = local_48 * 0.5;
      pvVar22 = (void *)((double)pvVar22 / (double)pcVar25);
    }
    if (dVar24 < 0.0) {
      local_58 = dVar23 + (double)pvVar22;
      local_48 = dVar15 - dVar17;
      local_38 = pvVar26;
      dVar24 = sqrt(dVar24);
      dVar15 = local_48;
      dVar23 = local_58;
      pvVar26 = local_38;
    }
    else {
      dVar24 = SQRT(dVar24);
      dVar15 = dVar15 - dVar17;
      dVar23 = dVar23 + (double)pvVar22;
    }
    *auxstat = dVar23;
    auxstat[1] = dVar21 * (dVar2 / dVar18) + (dVar15 * sig * local_50) / ((double)pvVar26 * dVar24);
    *laux = 2;
    iVar5 = strcmp(pcVar4,"Z-tau");
    if (iVar5 == 0) {
      local_38 = (void *)((*(double *)((long)prVar7 + 0xd0) + -1.0) /
                         *(double *)((long)prVar7 + 0xe8));
      dVar15 = local_68 / local_88;
      if (dVar15 < 0.0) {
        local_60 = sqrt(dVar15);
      }
      else {
        local_60 = SQRT(dVar15);
      }
      if (local_88 < 0.0) {
        pdVar9 = (double *)sqrt(local_88);
      }
      else {
        pdVar9 = (double *)SQRT(local_88);
      }
      __x = local_40;
      if ((double)local_40 < 0.0) {
        local_40 = pdVar9;
        dVar15 = sqrt((double)__x);
        pdVar9 = local_40;
      }
      else {
        dVar15 = SQRT((double)local_40);
      }
      *teststat = local_60 * (double)local_38 + (local_50 * (double)pdVar9) / dVar15;
    }
    else {
      iVar5 = strcmp(pcVar4,"Z-alpha");
      if (iVar5 == 0) {
        *teststat = local_60 * (*(double *)((long)prVar7 + 0xd0) + -1.0) +
                    (double)local_70 / (double)local_40;
        cval[2] = NAN;
        cval[1] = NAN;
        *cval = NAN;
      }
    }
    free(pvVar19);
    free(pdVar6);
  }
  else {
    iVar5 = strcmp(model,"constant");
    dVar15 = local_58;
    if (iVar5 != 0) {
      return;
    }
    iVar5 = local_58._0_4_;
    dVar20 = (double)(local_58._0_4_ * local_58._0_4_);
    *cval = -29.25 / dVar20 + -5.999 / local_60 + -3.4335;
    cval[1] = -8.36 / dVar20 + -2.738 / local_60 + -2.8621;
    cval[2] = -4.48 / dVar20 + -1.438 / local_60 + -2.5671;
    *cprobs = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;
    local_e8 = (double *)malloc(0x20);
    sVar11 = (long)iVar5 << 3;
    pdVar6 = (double *)malloc(sVar11);
    res = (double *)malloc(sVar11);
    memcpy(pdVar6,local_40,sVar11);
    prVar7 = reg_init(iVar5,2);
    local_70 = pdVar6;
    regress(prVar7,pdVar6,pdVar12,res,local_e8,0.95);
    dVar23 = prVar7->beta[0].value;
    dVar2 = prVar7->beta[0].stdErr;
    sig = (double)prVar7;
    dVar16 = mean(pdVar12,iVar5);
    dVar18 = 0.0;
    dVar24 = 0.0;
    local_68 = 0.0;
    local_48 = 0.0;
    if (1 < (int)local_38) {
      uVar10 = 0;
      do {
        dVar18 = dVar18 + res[uVar10] * res[uVar10];
        dVar21 = pdVar12[uVar10];
        dVar24 = dVar24 + (dVar21 - dVar16) * (dVar21 - dVar16);
        local_48 = local_48 + dVar21;
        local_68 = local_68 + dVar21 * dVar21;
        uVar10 = uVar10 + 1;
      } while (((ulong)dVar15 & 0xffffffff) != uVar10);
    }
    local_40 = (double *)((1.0 / local_60) * dVar18);
    dVar16 = pow(local_60,-1.5);
    dVar15 = local_50;
    iVar5 = SUB84(local_50,0);
    pvVar8 = malloc((long)iVar5 * 4);
    sVar11 = (long)iVar5 * 8;
    local_a8 = (double *)malloc(sVar11);
    local_c0 = (double *)malloc(sVar11);
    if (0 < iVar5) {
      uVar13 = (ulong)dVar15 & 0xffffffff;
      uVar10 = 0;
      do {
        uVar1 = uVar10 + 1;
        *(int *)((long)pvVar8 + uVar10 * 4) = (int)uVar1;
        uVar10 = uVar1;
      } while (uVar13 != uVar1);
      if (0 < iVar5) {
        uVar10 = 0;
        iVar5 = local_58._0_4_;
        pdVar12 = local_a8;
        local_38 = pvVar8;
        do {
          iVar3 = *(int *)((long)local_38 + uVar10 * 4);
          mmult(res + iVar3,res,pdVar12,1,iVar5 - iVar3,1);
          uVar10 = uVar10 + 1;
          pdVar12 = pdVar12 + 1;
        } while (uVar13 != uVar10);
        iVar5 = SUB84(local_50,0);
        pvVar8 = local_38;
        if (0 < iVar5) {
          uVar10 = 0;
          do {
            local_c0[uVar10] =
                 1.0 - (double)*(int *)((long)local_38 + uVar10 * 4) / (double)(iVar5 + 1);
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
        }
      }
    }
    local_38 = (void *)(1.0 / dVar20);
    mmult(local_c0,local_a8,&local_88,1,iVar5,1);
    local_88 = (local_88 + local_88) / local_60 + (double)local_40;
    dVar15 = (double)local_40 / local_88;
    local_58 = local_88;
    if (dVar15 < 0.0) {
      local_50 = sqrt(dVar15);
    }
    else {
      local_50 = SQRT(dVar15);
    }
    pcVar4 = local_78;
    prVar7 = (reg_object)sig;
    if (local_88 < 0.0) {
      local_68 = local_68 * (double)local_38;
      local_78 = (char *)sqrt(local_88);
      dVar15 = local_68;
    }
    else {
      local_78 = (char *)SQRT(local_88);
      dVar15 = local_68 * (double)local_38;
    }
    pdVar12 = local_70;
    local_38 = (void *)((double)local_38 * dVar24);
    if (dVar15 < 0.0) {
      pdVar6 = (double *)sqrt(dVar15);
    }
    else {
      pdVar6 = (double *)SQRT(dVar15);
    }
    local_48 = local_48 * dVar16;
    local_68 = local_58 - (double)local_40;
    if ((double)local_38 < 0.0) {
      local_70 = pdVar6;
      dVar15 = sqrt((double)local_38);
      pdVar6 = local_70;
    }
    else {
      dVar15 = SQRT((double)local_38);
    }
    local_68 = local_68 * -0.5;
    *auxstat = local_50 * (dVar23 / dVar2) +
               (local_48 * (double)local_78 * (local_68 / local_58)) / ((double)pdVar6 * dVar15);
    *laux = 1;
    local_48 = local_68 / local_58;
    iVar5 = strcmp(pcVar4,"Z-tau");
    if (iVar5 == 0) {
      local_60 = (*(double *)((long)prVar7 + 0xd0) + -1.0) / *(double *)((long)prVar7 + 0xe8);
      dVar15 = (double)local_40 / local_88;
      if (dVar15 < 0.0) {
        local_40 = (double *)sqrt(dVar15);
      }
      else {
        local_40 = (double *)SQRT(dVar15);
      }
      if (local_88 < 0.0) {
        pvVar19 = (void *)sqrt(local_88);
      }
      else {
        pvVar19 = (void *)SQRT(local_88);
      }
      pvVar22 = local_38;
      if ((double)local_38 < 0.0) {
        local_38 = pvVar19;
        dVar15 = sqrt((double)pvVar22);
        pvVar19 = local_38;
      }
      else {
        dVar15 = SQRT((double)local_38);
      }
      *teststat = (double)local_40 * local_60 + (local_48 * (double)pvVar19) / dVar15;
    }
    else {
      iVar5 = strcmp(pcVar4,"Z-alpha");
      if (iVar5 == 0) {
        *teststat = local_60 * (*(double *)((long)prVar7 + 0xd0) + -1.0) +
                    local_68 / (double)local_38;
        cval[2] = NAN;
        cval[1] = NAN;
        *cval = NAN;
      }
    }
  }
  free(local_e8);
  free(pdVar12);
  free(res);
  free(pvVar8);
  free(local_a8);
  free(local_c0);
  free_reg(prVar7);
  return;
}

Assistant:

void ur_pp2(double *x, int N,const char* type,const char* model,int lshort, int *klag,double *cval,double *cprobs, double *auxstat,int *laux,double *teststat) {
    /* 
    ur_pp2
    C version of the R code by
    Bernhard Pfaff [aut, cre], Eric Zivot [ctb], Matthieu Stigler [ctb]. urca: Unit Root and Cointegration Tests for Time Series Data
    License Information : https://cran.r-project.org/web/packages/urca/urca.pdf
    */
    double *y,*y_li,*trend,*XX,*varcovar,*res,*tt,*coprods,*weights;
    int *idx;
    int N1, lmax, i,p, N12,len,iter;
    double N1d,at,my_tstat,beta_tstat,s,sum_res,sum_ymy,sum_y2,ymean,tstat;
    double myybar,myy,mty,my,sum_y,sig,lambda,lambda_prime,M,my_stat,beta_stat;
    reg_object fit;

    N1 = N - 1;
    y = &x[1];// length N1
    y_li = &x[0];// Length N1

    if (lshort == 1) {
        lmax = (int) 4.0 * pow(((double) N1)/100.0,0.25);
    } else {
        lmax = (int) 12.0 * pow(((double) N1)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        lmax = *klag;
    }

    if (!strcmp(model,"trend")) {
        cval[0] = -3.9638-8.353/N1-47.44/(N1*N1);
        cval[1] = -3.4126-4.039/N1-17.83/(N1*N1);
        cval[2] = -3.1279-2.418/N1-7.58/(N1*N1);
        cprobs[0] = 0.01;
        cprobs[1] = 0.05;
        cprobs[2] = 0.1;

        //mdisplay(cval,1,3);
        trend = (double*)malloc(sizeof(double)*N1);
        tt = (double*)malloc(sizeof(double)*N1);
        N1d = (double) N1 / 2.0;

        for(i = 1; i <= N1;++i) {
            trend[i-1] = (double)i - N1d;
            tt[i-1] = (double) i;
        } 

        p = 3;
        varcovar = (double*)malloc(sizeof(double)*p*p);
        XX = (double*)malloc(sizeof(double)*2*N1);
        res = (double*)malloc(sizeof(double)*N1);

        memcpy(XX,y_li,sizeof(double)*N1);
        memcpy(XX+N1,trend,sizeof(double)*N1);

        at = 0.95;

        fit = reg_init(N1,p);

        regress(fit,XX,y,res,varcovar,at);

        /*summary(fit);
        anova(fit);
        mdisplay(res,1,N1);
        mdisplay(XX,2,N1);
        mdisplay(y,1,N1);
        */

        my_tstat = (fit->beta+0)->value/(fit->beta+0)->stdErr;
        beta_tstat = (fit->beta+2)->value/(fit->beta+2)->stdErr;

        //printf("c1 %g c2 %g \n",my_tstat,beta_tstat);

        sum_res = 0.0;
        sum_ymy = 0.0;
        sum_y2 = 0.0;
        sum_y = 0.0;
        mty = 0.0;

        ymean = mean(y,N1);
        N12 = N1 * N1;

        for(i = 0; i < N1;++i) {
            sum_res += (res[i] *res[i]);
            sum_ymy += (y[i] - ymean)*(y[i] - ymean);
            sum_y2 += (y[i] *y[i]);
            mty += (tt[i]*y[i]);
            sum_y += y[i];
        }

        s = 1.0 /(double)N1 * sum_res;
        myybar = 1.0 / (double) N12 *sum_ymy;
        myy = 1.0 / (double) N12 *sum_y2;
        mty = pow((double)N1, -2.5) * mty;
        my = pow((double)N1, -1.5) * sum_y;

        //printf("c1 %g c2 %g s %g sum_ymy %g sum_y2 %g mty %g my %g \n",my_tstat,beta_tstat,s,myybar,myy,mty,my);

        idx = (int*)malloc(sizeof(int)*lmax);
        coprods = (double*)malloc(sizeof(double)*lmax);
        weights = (double*)malloc(sizeof(double)*lmax);

        for(i = 0; i < lmax;++i) {
            idx[i] = i+1;
        }

        for(i = 0; i < lmax;++i) {
            iter = idx[i];
            len = N1 - iter;
            mmult(res+iter,res,coprods+i,1,len,1);
        }

        for(i = 0; i < lmax;++i) {
            weights[i] = 1.0 - (double) idx[i] / (double) (lmax+1);
        }

        //mdisplay(weights,1,lmax);

        mmult(weights,coprods,&sig,1,lmax,1);

        sig = s + 2.0 * sig / (double) N1;
        lambda = 0.5 * (sig - s);
        lambda_prime = lambda/sig;
        M = (1-pow((double)N1, -2.0))*myy - 12*mty*mty + 12.0*(1.0 + 1.0/(double)N1)*mty*my - (4 + 6/(double)N1 + 2/(double)(N1*N1))*my*my;
        my_stat = sqrt(s/sig)*my_tstat - lambda_prime*sqrt(sig)*my/(sqrt(M)*sqrt((M+my*my)));
        beta_stat = sqrt(s/sig)*beta_tstat - lambda_prime*sqrt(sig)*(0.5*my - mty)/(sqrt(M/12)*sqrt(myybar));
        auxstat[0] = my_stat;
        auxstat[1] = beta_stat;

        *laux = 2;

        if (!strcmp(type,"Z-tau")) {
            tstat = ((fit->beta+1)->value - 1.0)/(fit->beta+1)->stdErr;
            *teststat = sqrt(s/sig)*tstat-lambda_prime*sqrt(sig)/sqrt(M);
        } else if (!strcmp(type,"Z-alpha")) {
            *teststat = (double)N1 * ((fit->beta+1)->value - 1.0) - lambda/M;
            cval[0] = cval[1] = cval[2] = NAN;
        }

        //printf("sig %g lambda %g lambda_prime %g M %g my_stat %g beta_stat %g teststat %g \n",sig,lambda,lambda_prime,M,my_stat,beta_stat,*teststat);


        free(trend);
        free(varcovar);
        free(XX);
        free(res);
        free(tt);
        free(idx);
        free(coprods);
        free(weights);
        free_reg(fit);
    } else if (!strcmp(model,"constant")) {
        cval[0] = -3.4335-5.999/(double)N1-29.25/(double)(N1*N1);
        cval[1] = -2.8621-2.738/(double)N1-8.36/(double)(N1*N1);
        cval[2] = -2.5671-1.438/(double)N1-4.48/(double)(N1*N1);
        cprobs[0] = 0.01;
        cprobs[1] = 0.05;
        cprobs[2] = 0.1;

        //mdisplay(cval,1,3);

        p = 2;
        varcovar = (double*)malloc(sizeof(double)*p*p);
        XX = (double*)malloc(sizeof(double)*N1);
        res = (double*)malloc(sizeof(double)*N1);

        memcpy(XX,y_li,sizeof(double)*N1);

        at = 0.95;

        fit = reg_init(N1,p);

        regress(fit,XX,y,res,varcovar,at);

        //summary(fit);
        //anova(fit);
        //mdisplay(res,1,N1);
        //mdisplay(XX,2,N1);
        //mdisplay(y,1,N1);

        my_tstat = (fit->beta+0)->value/(fit->beta+0)->stdErr;

        sum_res = 0.0;
        sum_ymy = 0.0;
        sum_y2 = 0.0;
        sum_y = 0.0;

        ymean = mean(y,N1);
        N12 = N1 * N1;

        for(i = 0; i < N1;++i) {
            sum_res += (res[i] *res[i]);
            sum_ymy += (y[i] - ymean)*(y[i] - ymean);
            sum_y2 += (y[i] *y[i]);
            sum_y += y[i];
        }

        s = 1.0 /(double)N1 * sum_res;
        myybar = 1.0 / (double) N12 *sum_ymy;
        myy = 1.0 / (double) N12 *sum_y2;
        my = pow((double)N1, -1.5) * sum_y;

        //printf("c1 %g s %g sum_ymy %g sum_y2 %g my %g \n",my_tstat,s,myybar,myy,my);

        idx = (int*)malloc(sizeof(int)*lmax);
        coprods = (double*)malloc(sizeof(double)*lmax);
        weights = (double*)malloc(sizeof(double)*lmax);

        for(i = 0; i < lmax;++i) {
            idx[i] = i+1;
        }

        for(i = 0; i < lmax;++i) {
            iter = idx[i];
            len = N1 - iter;
            mmult(res+iter,res,coprods+i,1,len,1);
        }

        for(i = 0; i < lmax;++i) {
            weights[i] = 1.0 - (double) idx[i] / (double) (lmax+1);
        }

        //mdisplay(coprods,1,lmax);

        //mdisplay(weights,1,lmax);

        mmult(weights,coprods,&sig,1,lmax,1);

        sig = s + 2.0 * sig / (double) N1;
        lambda = 0.5 * (sig - s);
        lambda_prime = lambda/sig;

        my_stat = sqrt(s/sig)*my_tstat - lambda_prime*sqrt(sig)*my/(sqrt(myy)*sqrt(myybar));
        auxstat[0] = my_stat;
        *laux = 1;

        if (!strcmp(type,"Z-tau")) {
            tstat = ((fit->beta+1)->value - 1.0)/(fit->beta+1)->stdErr;
            *teststat = sqrt(s/sig)*tstat-lambda_prime*sqrt(sig)/sqrt(myybar);
        } else if (!strcmp(type,"Z-alpha")) {
            *teststat = (double)N1 * ((fit->beta+1)->value - 1.0) - lambda/myybar;
            cval[0] = cval[1] = cval[2] = NAN;
        }

        //printf("sig %g lambda %g lambda_prime %g my_stat %g teststat %g \n",sig,lambda,lambda_prime,my_stat,*teststat);
        



        free(varcovar);
        free(XX);
        free(res);
        free(idx);
        free(coprods);
        free(weights);
        free_reg(fit);
    }
}